

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_sse41.h
# Opt level: O0

void __thiscall highwayhash::SSE41::HHStateSSE41::Finalize(HHStateSSE41 *this,HHResult128 *result)

{
  undefined1 local_58 [8];
  V2x64U hash;
  V2x64U sum1;
  V2x64U sum0;
  int local_1c;
  int n;
  HHResult128 *result_local;
  HHStateSSE41 *this_local;
  
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    PermuteAndUpdate(this);
  }
  operator+((SSE41 *)(sum1.v_ + 1),&this->v0L,&this->mul0L);
  operator+((SSE41 *)(hash.v_ + 1),&this->v1H,&this->mul1H);
  operator+((SSE41 *)local_58,(V128<unsigned_long> *)(sum1.v_ + 1),
            (V128<unsigned_long> *)(hash.v_ + 1));
  StoreUnaligned<unsigned_long>((V128<unsigned_long> *)local_58,*result);
  return;
}

Assistant:

HH_INLINE void Finalize(HHResult128* HH_RESTRICT result) {
    for (int n = 0; n < 6; n++) {
      PermuteAndUpdate();
    }

    const V2x64U sum0 = v0L + mul0L;
    const V2x64U sum1 = v1H + mul1H;
    const V2x64U hash = sum0 + sum1;
    StoreUnaligned(hash, &(*result)[0]);
  }